

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcUniformBlockCase.cpp
# Opt level: O2

bool __thiscall deqp::UniformBlockCase::render(UniformBlockCase *this,ShaderProgram *program)

{
  string *this_00;
  RenderContext *context;
  TestLog *pTVar1;
  long lVar2;
  int iVar3;
  deUint32 dVar4;
  int iVar5;
  undefined4 extraout_var;
  int *piVar6;
  Surface *surface;
  void *__buf;
  int iVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  allocator<char> local_25e;
  allocator<char> local_25d;
  int local_25c;
  deUint16 indices [6];
  undefined4 uStack_24c;
  string local_240;
  TestLog *local_220;
  ShaderProgram *local_218;
  long local_210;
  float position [16];
  Random rnd;
  VertexArrayBinding posArray;
  undefined4 extraout_var_00;
  
  local_220 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_218 = program;
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  local_210 = CONCAT44(extraout_var,iVar3);
  dVar4 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p)
  ;
  deRandom_init(&rnd.m_rnd,dVar4);
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[4])();
  piVar6 = (int *)CONCAT44(extraout_var_00,iVar3);
  iVar3 = *piVar6;
  iVar7 = 0x80;
  if (iVar3 < 0x80) {
    iVar7 = iVar3;
  }
  iVar8 = 0x80;
  if (piVar6[1] < 0x80) {
    iVar8 = piVar6[1];
  }
  iVar3 = de::Random::getInt((Random *)&rnd.m_rnd,0,iVar3 - iVar7);
  iVar5 = de::Random::getInt((Random *)&rnd.m_rnd,0,piVar6[1] - iVar8);
  lVar2 = local_210;
  position[0xc] = 1.0;
  position[0xd] = 1.0;
  position[0xe] = 0.0;
  position[0xf] = 1.0;
  position[8] = 1.0;
  position[9] = -1.0;
  position[10] = 0.0;
  position[0xb] = 1.0;
  position[4] = -1.0;
  position[5] = 1.0;
  position[6] = 0.0;
  position[7] = 1.0;
  position[0] = -1.0;
  position[1] = -1.0;
  position[2] = 0.0;
  position[3] = 1.0;
  indices[0] = 0;
  indices[1] = 1;
  indices[2] = 2;
  indices[3] = 2;
  indices[4] = 1;
  indices[5] = 3;
  local_25c = iVar3;
  (**(code **)(local_210 + 0x1a00))(iVar3,iVar5,iVar7,iVar8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_240,"a_position",&local_25e);
  glu::va::Float(&posArray,&local_240,4,4,0,position);
  std::__cxx11::string::~string((string *)&local_240);
  local_240._M_dataplus._M_p = (pointer)0x600000000;
  local_240._M_string_length._0_4_ = 1;
  local_240.field_2._M_allocated_capacity = (size_type)indices;
  glu::draw(((this->super_TestCase).m_context)->m_renderCtx,(local_218->m_program).m_program,1,
            &posArray,(PrimitiveList *)&local_240,(DrawUtilCallback *)0x0);
  dVar4 = (**(code **)(lVar2 + 0x800))();
  glu::checkError(dVar4,"Draw failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcUniformBlockCase.cpp"
                  ,0x75d);
  std::__cxx11::string::~string((string *)&posArray.binding.name);
  tcu::Surface::Surface((Surface *)indices,iVar7,iVar8);
  context = ((this->super_TestCase).m_context)->m_renderCtx;
  tcu::Surface::getAccess((PixelBufferAccess *)&posArray,(Surface *)indices);
  glu::readPixels(context,local_25c,iVar5,(PixelBufferAccess *)&posArray);
  dVar4 = (**(code **)(lVar2 + 0x800))();
  pTVar1 = local_220;
  glu::checkError(dVar4,"Reading pixels failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcUniformBlockCase.cpp"
                  ,0x766);
  iVar3 = 0;
  uVar9 = 0;
  if (0 < (int)indices._0_4_) {
    uVar9 = indices._0_8_ & 0xffffffff;
  }
  iVar7 = indices._4_4_;
  if ((int)indices._4_4_ < 1) {
    iVar7 = 0;
  }
  iVar8 = 0;
  for (iVar5 = 0; uVar11 = uVar9, iVar10 = iVar3, iVar5 != iVar7; iVar5 = iVar5 + 1) {
    while (uVar11 != 0) {
      iVar8 = iVar8 + (uint)(*(int *)(CONCAT44(uStack_24c,indices._8_4_) + (long)iVar10 * 4) != -1);
      uVar11 = uVar11 - 1;
      iVar10 = iVar10 + 1;
    }
    iVar3 = iVar3 + indices._0_4_;
  }
  if (0 < iVar8) {
    std::__cxx11::string::string<std::allocator<char>>((string *)position,"Image",&local_25e);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_240,"Rendered image",&local_25d);
    surface = (Surface *)indices;
    tcu::LogImage::LogImage
              ((LogImage *)&posArray,(string *)position,&local_240,surface,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)&posArray,(int)pTVar1,__buf,(size_t)surface);
    tcu::LogImage::~LogImage((LogImage *)&posArray);
    std::__cxx11::string::~string((string *)&local_240);
    std::__cxx11::string::~string((string *)position);
    posArray.binding._0_8_ = pTVar1;
    this_00 = &posArray.binding.name;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
    std::operator<<((ostream *)this_00,"Image comparison failed, got ");
    std::ostream::operator<<(this_00,iVar8);
    std::operator<<((ostream *)this_00," non-white pixels");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&posArray,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
  }
  tcu::Surface::~Surface((Surface *)indices);
  return iVar8 == 0;
}

Assistant:

bool UniformBlockCase::render(glu::ShaderProgram& program) const
{
	tcu::TestLog&			 log = m_testCtx.getLog();
	const glw::Functions&	gl  = m_context.getRenderContext().getFunctions();
	de::Random				 rnd(deStringHash(getName()));
	const tcu::RenderTarget& renderTarget = m_context.getRenderContext().getRenderTarget();
	const int				 viewportW	= de::min(renderTarget.getWidth(), 128);
	const int				 viewportH	= de::min(renderTarget.getHeight(), 128);
	const int				 viewportX	= rnd.getInt(0, renderTarget.getWidth() - viewportW);
	const int				 viewportY	= rnd.getInt(0, renderTarget.getHeight() - viewportH);

	// Draw
	{
		const float position[] = { -1.0f, -1.0f, 0.0f, 1.0f, -1.0f, +1.0f, 0.0f, 1.0f,
								   +1.0f, -1.0f, 0.0f, 1.0f, +1.0f, +1.0f, 0.0f, 1.0f };
		const deUint16 indices[] = { 0, 1, 2, 2, 1, 3 };

		gl.viewport(viewportX, viewportY, viewportW, viewportH);

		glu::VertexArrayBinding posArray = glu::va::Float("a_position", 4, 4, 0, &position[0]);
		glu::draw(m_context.getRenderContext(), program.getProgram(), 1, &posArray,
				  glu::pr::Triangles(DE_LENGTH_OF_ARRAY(indices), &indices[0]));
		GLU_EXPECT_NO_ERROR(gl.getError(), "Draw failed");
	}

	// Verify that all pixels are white.
	{
		tcu::Surface pixels(viewportW, viewportH);
		int			 numFailedPixels = 0;

		glu::readPixels(m_context.getRenderContext(), viewportX, viewportY, pixels.getAccess());
		GLU_EXPECT_NO_ERROR(gl.getError(), "Reading pixels failed");

		for (int y = 0; y < pixels.getHeight(); y++)
		{
			for (int x = 0; x < pixels.getWidth(); x++)
			{
				if (pixels.getPixel(x, y) != tcu::RGBA::white())
					numFailedPixels += 1;
			}
		}

		if (numFailedPixels > 0)
		{
			log << TestLog::Image("Image", "Rendered image", pixels);
			log << TestLog::Message << "Image comparison failed, got " << numFailedPixels << " non-white pixels"
				<< TestLog::EndMessage;
		}

		return numFailedPixels == 0;
	}
}